

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_readCTable(HUF_CElt *CTable,uint *maxSymbolValuePtr,void *src,size_t srcSize,
                     uint *hasZeroWeights)

{
  BYTE BVar1;
  int iVar2;
  size_t sVar3;
  byte bVar4;
  ushort uVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  BYTE BVar12;
  U32 nbSymbols;
  U32 tableLog;
  U16 valPerRank [14];
  U16 nbPerRank [14];
  U32 rankVal [16];
  BYTE huffWeight [256];
  U32 local_1b0;
  U32 local_1ac;
  ushort auStack_1a8 [16];
  short asStack_188 [16];
  U32 local_168;
  int aiStack_164 [15];
  BYTE local_128 [264];
  
  local_1ac = 0;
  local_1b0 = 0;
  sVar3 = HUF_readStats(local_128,0x100,&local_168,&local_1b0,&local_1ac,src,srcSize);
  sVar7 = sVar3;
  if (sVar3 < 0xffffffffffffff89) {
    uVar9 = (ulong)local_1ac;
    sVar7 = 0xffffffffffffffd4;
    if (uVar9 < 0xd) {
      uVar8 = (ulong)local_1b0;
      sVar7 = 0xffffffffffffffd0;
      if (local_1b0 <= *maxSymbolValuePtr + 1) {
        if (local_1ac != 0) {
          uVar6 = 0;
          iVar10 = 0;
          do {
            iVar2 = aiStack_164[uVar6];
            bVar4 = (byte)uVar6;
            aiStack_164[uVar6] = iVar10;
            uVar6 = uVar6 + 1;
            iVar10 = (iVar2 << (bVar4 & 0x1f)) + iVar10;
          } while (uVar9 != uVar6);
        }
        *hasZeroWeights = 0;
        if (uVar8 != 0) {
          uVar11 = *hasZeroWeights;
          uVar6 = 0;
          do {
            BVar1 = local_128[uVar6];
            BVar12 = ((char)local_1ac + '\x01') - BVar1;
            if (BVar1 == '\0') {
              BVar12 = '\0';
            }
            uVar11 = uVar11 | BVar1 == '\0';
            CTable[uVar6].nbBits = BVar12;
            uVar6 = uVar6 + 1;
          } while (uVar8 != uVar6);
          *hasZeroWeights = uVar11;
        }
        asStack_188[8] = 0;
        asStack_188[9] = 0;
        asStack_188[10] = 0;
        asStack_188[0xb] = 0;
        asStack_188[0xc] = 0;
        asStack_188[0xd] = 0;
        asStack_188[0] = 0;
        asStack_188[1] = 0;
        asStack_188[2] = 0;
        asStack_188[3] = 0;
        asStack_188[4] = 0;
        asStack_188[5] = 0;
        asStack_188[6] = 0;
        asStack_188[7] = 0;
        auStack_1a8[8] = 0;
        auStack_1a8[9] = 0;
        auStack_1a8[10] = 0;
        auStack_1a8[0xb] = 0;
        auStack_1a8[0xc] = 0;
        auStack_1a8[0xd] = 0;
        auStack_1a8[0] = 0;
        auStack_1a8[1] = 0;
        auStack_1a8[2] = 0;
        auStack_1a8[3] = 0;
        auStack_1a8[4] = 0;
        auStack_1a8[5] = 0;
        auStack_1a8[6] = 0;
        auStack_1a8[7] = 0;
        if (uVar8 != 0) {
          uVar6 = 0;
          do {
            asStack_188[CTable[uVar6].nbBits] = asStack_188[CTable[uVar6].nbBits] + 1;
            uVar6 = uVar6 + 1;
          } while (uVar8 != uVar6);
        }
        auStack_1a8[uVar9 + 1] = 0;
        if (local_1ac != 0) {
          uVar5 = 0;
          do {
            auStack_1a8[uVar9] = uVar5;
            uVar5 = (ushort)(uVar5 + asStack_188[uVar9]) >> 1;
            uVar9 = uVar9 - 1;
            local_1ac = local_1ac - 1;
          } while (local_1ac != 0);
        }
        if (uVar8 != 0) {
          uVar9 = 0;
          do {
            uVar5 = auStack_1a8[CTable[uVar9].nbBits];
            auStack_1a8[CTable[uVar9].nbBits] = uVar5 + 1;
            CTable[uVar9].val = uVar5;
            uVar9 = uVar9 + 1;
          } while (uVar8 != uVar9);
        }
        *maxSymbolValuePtr = local_1b0 - 1;
        sVar7 = sVar3;
      }
    }
  }
  return sVar7;
}

Assistant:

size_t HUF_readCTable (HUF_CElt* CTable, unsigned* maxSymbolValuePtr, const void* src, size_t srcSize, unsigned* hasZeroWeights)
{
    BYTE huffWeight[HUF_SYMBOLVALUE_MAX + 1];   /* init not required, even though some static analyzer may complain */
    U32 rankVal[HUF_TABLELOG_ABSOLUTEMAX + 1];   /* large enough for values from 0 to 16 */
    U32 tableLog = 0;
    U32 nbSymbols = 0;

    /* get symbol weights */
    CHECK_V_F(readSize, HUF_readStats(huffWeight, HUF_SYMBOLVALUE_MAX+1, rankVal, &nbSymbols, &tableLog, src, srcSize));

    /* check result */
    if (tableLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (nbSymbols > *maxSymbolValuePtr+1) return ERROR(maxSymbolValue_tooSmall);

    /* Prepare base value per rank */
    {   U32 n, nextRankStart = 0;
        for (n=1; n<=tableLog; n++) {
            U32 current = nextRankStart;
            nextRankStart += (rankVal[n] << (n-1));
            rankVal[n] = current;
    }   }

    /* fill nbBits */
    *hasZeroWeights = 0;
    {   U32 n; for (n=0; n<nbSymbols; n++) {
            const U32 w = huffWeight[n];
            *hasZeroWeights |= (w == 0);
            CTable[n].nbBits = (BYTE)(tableLog + 1 - w) & -(w != 0);
    }   }

    /* fill val */
    {   U16 nbPerRank[HUF_TABLELOG_MAX+2]  = {0};  /* support w=0=>n=tableLog+1 */
        U16 valPerRank[HUF_TABLELOG_MAX+2] = {0};
        { U32 n; for (n=0; n<nbSymbols; n++) nbPerRank[CTable[n].nbBits]++; }
        /* determine stating value per rank */
        valPerRank[tableLog+1] = 0;   /* for w==0 */
        {   U16 min = 0;
            U32 n; for (n=tableLog; n>0; n--) {  /* start at n=tablelog <-> w=1 */
                valPerRank[n] = min;     /* get starting value within each rank */
                min += nbPerRank[n];
                min >>= 1;
        }   }
        /* assign value within rank, symbol order */
        { U32 n; for (n=0; n<nbSymbols; n++) CTable[n].val = valPerRank[CTable[n].nbBits]++; }
    }

    *maxSymbolValuePtr = nbSymbols - 1;
    return readSize;
}